

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hive_partitioning.cpp
# Opt level: O1

void __thiscall
duckdb::PartitioningColumnValue::~PartitioningColumnValue(PartitioningColumnValue *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->value)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->value).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->key)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->key).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

explicit PartitioningColumnValue(string value_p) : value(std::move(value_p)) {
	}